

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O1

void __thiscall helics::Federate::enteringExecutingMode(Federate *this,iteration_time res)

{
  Modes newMode;
  Time TVar1;
  bool local_19;
  TimeRepresentation<count_time<9,_long>_> local_18;
  
  TVar1 = res.grantedTime.internalTimeCode;
  switch(res.state) {
  case NEXT_STEP:
    updateFederateMode(this,EXECUTING);
    (this->mCurrentTime).internalTimeCode = TVar1.internalTimeCode;
    if ((this->timeUpdateCallback).super__Function_base._M_manager != (_Manager_type)0x0) {
      local_19 = false;
      local_18.internalTimeCode = TVar1.internalTimeCode;
      (*(this->timeUpdateCallback)._M_invoker)
                ((_Any_data *)&this->timeUpdateCallback,&local_18,&local_19);
    }
    (*this->_vptr_Federate[0xc])(this,TVar1.internalTimeCode,0);
    if ((this->timeRequestReturnCallback).super__Function_base._M_manager != (_Manager_type)0x0) {
      local_18.internalTimeCode = (this->mCurrentTime).internalTimeCode;
      local_19 = false;
      (*(this->timeRequestReturnCallback)._M_invoker)
                ((_Any_data *)&this->timeRequestReturnCallback,&local_18,&local_19);
    }
  default:
    return;
  case ITERATING:
    (this->mCurrentTime).internalTimeCode = -1;
    enteringInitializingMode(this,ITERATING);
    (*this->_vptr_Federate[0xc])(this,TVar1.internalTimeCode,2);
    return;
  case HALTED:
    newMode = FINISHED;
    break;
  case ERROR_RESULT:
    newMode = ERROR_STATE;
  }
  updateFederateMode(this,newMode);
  return;
}

Assistant:

void Federate::enteringExecutingMode(iteration_time res)
{
    switch (res.state) {
        case IterationResult::NEXT_STEP:
            updateFederateMode(Modes::EXECUTING);

            mCurrentTime = res.grantedTime;
            if (timeUpdateCallback) {
                timeUpdateCallback(mCurrentTime, false);
            }
            initializeToExecuteStateTransition(res);
            if (timeRequestReturnCallback) {
                timeRequestReturnCallback(mCurrentTime, false);
            }
            break;
        case IterationResult::ITERATING:
            mCurrentTime = initializationTime;

            enteringInitializingMode(res.state);

            initializeToExecuteStateTransition(res);
            break;
        case IterationResult::ERROR_RESULT:
            updateFederateMode(Modes::ERROR_STATE);
            break;
        case IterationResult::HALTED:
            updateFederateMode(Modes::FINISHED);
            break;
    }
}